

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void fadst8x4_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined2 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  int32_t *piVar31;
  char in_DL;
  undefined1 (*in_RSI) [16];
  undefined8 *in_RDI;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  __m128i v_hi [8];
  __m128i v_lo [8];
  __m128i u_hi [8];
  __m128i u_lo [8];
  __m128i in7;
  __m128i __rounding;
  __m128i __zero;
  __m128i sinpi_p03_p03;
  __m128i sinpi_m03_p02;
  __m128i sinpi_p03_p04;
  __m128i sinpi_p04_m01;
  __m128i sinpi_p01_p02;
  int32_t *sinpi;
  undefined2 uStack_a04;
  undefined2 uStack_a02;
  undefined2 uStack_9fc;
  undefined2 uStack_9fa;
  undefined2 uStack_9f4;
  undefined2 uStack_9f2;
  undefined2 uStack_9ec;
  undefined2 uStack_9ea;
  undefined2 uStack_9e4;
  undefined2 uStack_9e2;
  undefined2 uStack_9dc;
  undefined2 uStack_9da;
  undefined2 uStack_9d4;
  undefined2 uStack_9d2;
  undefined2 uStack_9cc;
  undefined2 uStack_9ca;
  undefined2 uStack_984;
  undefined2 uStack_982;
  undefined2 uStack_97c;
  undefined2 uStack_97a;
  undefined2 uStack_974;
  undefined2 uStack_972;
  undefined2 uStack_96c;
  undefined2 uStack_96a;
  undefined2 uStack_964;
  undefined2 uStack_962;
  undefined2 uStack_95c;
  undefined2 uStack_95a;
  undefined2 uStack_954;
  undefined2 uStack_952;
  undefined2 uStack_94c;
  undefined2 uStack_94a;
  ushort local_838;
  undefined2 uStack_836;
  ushort uStack_834;
  undefined2 uStack_832;
  ushort local_818;
  undefined2 uStack_816;
  ushort uStack_814;
  undefined2 uStack_812;
  undefined2 local_7e8;
  undefined2 uStack_7e6;
  undefined2 uStack_7e4;
  undefined2 uStack_7e2;
  undefined2 local_7d8;
  undefined2 uStack_7d6;
  undefined2 uStack_7d4;
  undefined2 uStack_7d2;
  undefined2 local_7c8;
  undefined2 uStack_7c6;
  undefined2 uStack_7c4;
  undefined2 uStack_7c2;
  undefined2 local_7b8;
  undefined2 uStack_7b6;
  undefined2 uStack_7b4;
  undefined2 uStack_7b2;
  ushort uStack_790;
  undefined2 uStack_78e;
  ushort uStack_78c;
  undefined2 uStack_78a;
  ushort uStack_770;
  undefined2 uStack_76e;
  ushort uStack_76c;
  undefined2 uStack_76a;
  undefined2 uStack_740;
  undefined2 uStack_73e;
  undefined2 uStack_73c;
  undefined2 uStack_73a;
  undefined2 uStack_730;
  undefined2 uStack_72e;
  undefined2 uStack_72c;
  undefined2 uStack_72a;
  undefined2 uStack_720;
  undefined2 uStack_71e;
  undefined2 uStack_71c;
  undefined2 uStack_71a;
  undefined2 uStack_710;
  undefined2 uStack_70e;
  undefined2 uStack_70c;
  undefined2 uStack_70a;
  int iStack_4f4;
  int iStack_4ec;
  int iStack_4d4;
  int iStack_4cc;
  int iStack_4b4;
  int iStack_4ac;
  int iStack_494;
  int iStack_48c;
  int iStack_474;
  int iStack_46c;
  int iStack_454;
  int iStack_44c;
  int iStack_434;
  int iStack_42c;
  int iStack_414;
  int iStack_40c;
  int local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  int local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  int local_3e8;
  int iStack_3e4;
  int iStack_3e0;
  int iStack_3dc;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int local_3a8;
  int iStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  int iStack_e4;
  int iStack_dc;
  int iStack_d4;
  int iStack_cc;
  int iStack_c4;
  int iStack_bc;
  int iStack_b4;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_58;
  int local_38;
  
  piVar31 = sinpi_arr((int)in_DL);
  uVar26 = (uint)*(ushort *)(piVar31 + 1) | piVar31[2] << 0x10;
  iVar27 = (uint)*(ushort *)(piVar31 + 4) + piVar31[1] * -0x10000;
  uVar28 = (uint)*(ushort *)(piVar31 + 3) | piVar31[4] << 0x10;
  uVar29 = -piVar31[3] & 0xffffU | piVar31[2] << 0x10;
  uVar1 = (undefined2)piVar31[3];
  uVar24 = CONCAT26(uVar1,CONCAT24(uVar1,CONCAT22(uVar1,uVar1)));
  uVar25 = CONCAT26(uVar1,CONCAT24(uVar1,CONCAT22(uVar1,uVar1)));
  iVar30 = 1 << (in_DL - 1U & 0x1f);
  uVar2 = *in_RDI;
  uVar3 = in_RDI[1];
  uVar4 = in_RDI[2];
  uVar5 = in_RDI[3];
  local_158 = (short)uVar2;
  sStack_156 = (short)((ulong)uVar2 >> 0x10);
  sStack_154 = (short)((ulong)uVar2 >> 0x20);
  sStack_152 = (short)((ulong)uVar2 >> 0x30);
  sStack_150 = (short)uVar3;
  sStack_14e = (short)((ulong)uVar3 >> 0x10);
  sStack_14c = (short)((ulong)uVar3 >> 0x20);
  sStack_14a = (short)((ulong)uVar3 >> 0x30);
  local_168 = (short)uVar4;
  sStack_166 = (short)((ulong)uVar4 >> 0x10);
  sStack_164 = (short)((ulong)uVar4 >> 0x20);
  sStack_162 = (short)((ulong)uVar4 >> 0x30);
  sStack_160 = (short)uVar5;
  sStack_15e = (short)((ulong)uVar5 >> 0x10);
  sStack_15c = (short)((ulong)uVar5 >> 0x20);
  sStack_15a = (short)((ulong)uVar5 >> 0x30);
  uVar2 = *in_RDI;
  uVar3 = in_RDI[2];
  local_7b8 = (undefined2)uVar2;
  uStack_7b6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_7b4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_7b2 = (undefined2)((ulong)uVar2 >> 0x30);
  local_7c8 = (undefined2)uVar3;
  uStack_7c6 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_7c4 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_7c2 = (undefined2)((ulong)uVar3 >> 0x30);
  uVar2 = in_RDI[1];
  uVar3 = in_RDI[3];
  uStack_710 = (undefined2)uVar2;
  uStack_70e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_70c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_70a = (undefined2)((ulong)uVar2 >> 0x30);
  uStack_720 = (undefined2)uVar3;
  uStack_71e = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_71c = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_71a = (undefined2)((ulong)uVar3 >> 0x30);
  uVar2 = in_RDI[4];
  uVar3 = in_RDI[6];
  local_7d8 = (undefined2)uVar2;
  uStack_7d6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_7d4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_7d2 = (undefined2)((ulong)uVar2 >> 0x30);
  local_7e8 = (undefined2)uVar3;
  uStack_7e6 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_7e4 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_7e2 = (undefined2)((ulong)uVar3 >> 0x30);
  uVar2 = in_RDI[5];
  uVar3 = in_RDI[7];
  uStack_730 = (undefined2)uVar2;
  uStack_72e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_72c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_72a = (undefined2)((ulong)uVar2 >> 0x30);
  uStack_740 = (undefined2)uVar3;
  uStack_73e = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_73c = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_73a = (undefined2)((ulong)uVar3 >> 0x30);
  uVar2 = in_RDI[4];
  local_818 = (ushort)uVar2;
  uStack_816 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_814 = (ushort)((ulong)uVar2 >> 0x20);
  uStack_812 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar2 = in_RDI[5];
  uStack_770 = (ushort)uVar2;
  uStack_76e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_76c = (ushort)((ulong)uVar2 >> 0x20);
  uStack_76a = (undefined2)((ulong)uVar2 >> 0x30);
  uVar2 = in_RDI[6];
  local_838 = (ushort)uVar2;
  uStack_836 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_834 = (ushort)((ulong)uVar2 >> 0x20);
  uStack_832 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar2 = in_RDI[7];
  uStack_790 = (ushort)uVar2;
  uStack_78e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_78c = (ushort)((ulong)uVar2 >> 0x20);
  uStack_78a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar15._2_2_ = local_7c8;
  auVar15._0_2_ = local_7b8;
  auVar15._4_2_ = uStack_7b6;
  auVar15._6_2_ = uStack_7c6;
  auVar15._10_2_ = uStack_7c4;
  auVar15._8_2_ = uStack_7b4;
  auVar15._12_2_ = uStack_7b2;
  auVar15._14_2_ = uStack_7c2;
  auVar32._8_8_ = CONCAT44(uVar26,uVar26);
  auVar32._0_8_ = CONCAT44(uVar26,uVar26);
  auVar32 = pmaddwd(auVar15,auVar32);
  auVar14._2_2_ = uStack_720;
  auVar14._0_2_ = uStack_710;
  auVar14._4_2_ = uStack_70e;
  auVar14._6_2_ = uStack_71e;
  auVar14._10_2_ = uStack_71c;
  auVar14._8_2_ = uStack_70c;
  auVar14._12_2_ = uStack_70a;
  auVar14._14_2_ = uStack_71a;
  auVar33._8_8_ = CONCAT44(uVar26,uVar26);
  auVar33._0_8_ = CONCAT44(uVar26,uVar26);
  auVar33 = pmaddwd(auVar14,auVar33);
  auVar13._2_2_ = local_7e8;
  auVar13._0_2_ = local_7d8;
  auVar13._4_2_ = uStack_7d6;
  auVar13._6_2_ = uStack_7e6;
  auVar13._10_2_ = uStack_7e4;
  auVar13._8_2_ = uStack_7d4;
  auVar13._12_2_ = uStack_7d2;
  auVar13._14_2_ = uStack_7e2;
  auVar34._8_8_ = CONCAT44(uVar28,uVar28);
  auVar34._0_8_ = CONCAT44(uVar28,uVar28);
  auVar34 = pmaddwd(auVar13,auVar34);
  auVar12._2_2_ = uStack_740;
  auVar12._0_2_ = uStack_730;
  auVar12._4_2_ = uStack_72e;
  auVar12._6_2_ = uStack_73e;
  auVar12._10_2_ = uStack_73c;
  auVar12._8_2_ = uStack_72c;
  auVar12._12_2_ = uStack_72a;
  auVar12._14_2_ = uStack_73a;
  auVar35._8_8_ = CONCAT44(uVar28,uVar28);
  auVar35._0_8_ = CONCAT44(uVar28,uVar28);
  auVar35 = pmaddwd(auVar12,auVar35);
  auVar11._2_2_ = 0;
  auVar11._0_2_ = local_158 + local_168;
  auVar11._4_2_ = sStack_156 + sStack_166;
  auVar11._6_2_ = 0;
  auVar11._10_2_ = 0;
  auVar11._8_2_ = sStack_154 + sStack_164;
  auVar11._12_2_ = sStack_152 + sStack_162;
  auVar11._14_2_ = 0;
  auVar36._8_8_ = uVar25;
  auVar36._0_8_ = uVar24;
  auVar36 = pmaddwd(auVar11,auVar36);
  auVar10._2_2_ = 0;
  auVar10._0_2_ = sStack_150 + sStack_160;
  auVar10._4_2_ = sStack_14e + sStack_15e;
  auVar10._6_2_ = 0;
  auVar10._10_2_ = 0;
  auVar10._8_2_ = sStack_14c + sStack_15c;
  auVar10._12_2_ = sStack_14a + sStack_15a;
  auVar10._14_2_ = 0;
  auVar37._8_8_ = uVar25;
  auVar37._0_8_ = uVar24;
  auVar37 = pmaddwd(auVar10,auVar37);
  auVar9._2_2_ = local_7c8;
  auVar9._0_2_ = local_7b8;
  auVar9._4_2_ = uStack_7b6;
  auVar9._6_2_ = uStack_7c6;
  auVar9._10_2_ = uStack_7c4;
  auVar9._8_2_ = uStack_7b4;
  auVar9._12_2_ = uStack_7b2;
  auVar9._14_2_ = uStack_7c2;
  auVar38._8_8_ = CONCAT44(iVar27,iVar27);
  auVar38._0_8_ = CONCAT44(iVar27,iVar27);
  auVar38 = pmaddwd(auVar9,auVar38);
  auVar8._2_2_ = uStack_720;
  auVar8._0_2_ = uStack_710;
  auVar8._4_2_ = uStack_70e;
  auVar8._6_2_ = uStack_71e;
  auVar8._10_2_ = uStack_71c;
  auVar8._8_2_ = uStack_70c;
  auVar8._12_2_ = uStack_70a;
  auVar8._14_2_ = uStack_71a;
  auVar39._8_8_ = CONCAT44(iVar27,iVar27);
  auVar39._0_8_ = CONCAT44(iVar27,iVar27);
  auVar39 = pmaddwd(auVar8,auVar39);
  auVar7._2_2_ = local_7e8;
  auVar7._0_2_ = local_7d8;
  auVar7._4_2_ = uStack_7d6;
  auVar7._6_2_ = uStack_7e6;
  auVar7._10_2_ = uStack_7e4;
  auVar7._8_2_ = uStack_7d4;
  auVar7._12_2_ = uStack_7d2;
  auVar7._14_2_ = uStack_7e2;
  auVar40._8_8_ = CONCAT44(uVar29,uVar29);
  auVar40._0_8_ = CONCAT44(uVar29,uVar29);
  auVar40 = pmaddwd(auVar7,auVar40);
  auVar6._2_2_ = uStack_740;
  auVar6._0_2_ = uStack_730;
  auVar6._4_2_ = uStack_72e;
  auVar6._6_2_ = uStack_73e;
  auVar6._10_2_ = uStack_73c;
  auVar6._8_2_ = uStack_72c;
  auVar6._12_2_ = uStack_72a;
  auVar6._14_2_ = uStack_73a;
  auVar41._8_8_ = CONCAT44(uVar29,uVar29);
  auVar41._0_8_ = CONCAT44(uVar29,uVar29);
  auVar41 = pmaddwd(auVar6,auVar41);
  auVar50._2_2_ = 0;
  auVar50._0_2_ = local_818;
  auVar50._4_2_ = uStack_816;
  auVar50._6_2_ = 0;
  auVar50._10_2_ = 0;
  auVar50._8_2_ = uStack_814;
  auVar50._12_2_ = uStack_812;
  auVar50._14_2_ = 0;
  auVar42._8_8_ = uVar25;
  auVar42._0_8_ = uVar24;
  auVar42 = pmaddwd(auVar50,auVar42);
  auVar49._2_2_ = 0;
  auVar49._0_2_ = uStack_770;
  auVar49._4_2_ = uStack_76e;
  auVar49._6_2_ = 0;
  auVar49._10_2_ = 0;
  auVar49._8_2_ = uStack_76c;
  auVar49._12_2_ = uStack_76a;
  auVar49._14_2_ = 0;
  auVar43._8_8_ = uVar25;
  auVar43._0_8_ = uVar24;
  auVar43 = pmaddwd(auVar49,auVar43);
  auVar48._2_2_ = 0;
  auVar48._0_2_ = local_838;
  auVar48._4_2_ = uStack_836;
  auVar48._6_2_ = 0;
  auVar48._10_2_ = 0;
  auVar48._8_2_ = uStack_834;
  auVar48._12_2_ = uStack_832;
  auVar48._14_2_ = 0;
  auVar44._8_8_ = uVar25;
  auVar44._0_8_ = uVar24;
  auVar44 = pmaddwd(auVar48,auVar44);
  auVar47._2_2_ = 0;
  auVar47._0_2_ = uStack_790;
  auVar47._4_2_ = uStack_78e;
  auVar47._6_2_ = 0;
  auVar47._10_2_ = 0;
  auVar47._8_2_ = uStack_78c;
  auVar47._12_2_ = uStack_78a;
  auVar47._14_2_ = 0;
  auVar45._8_8_ = uVar25;
  auVar45._0_8_ = uVar24;
  auVar45 = pmaddwd(auVar47,auVar45);
  local_398 = auVar32._0_4_;
  iStack_394 = auVar32._4_4_;
  iStack_390 = auVar32._8_4_;
  iStack_38c = auVar32._12_4_;
  local_3a8 = auVar34._0_4_;
  iStack_3a4 = auVar34._4_4_;
  iStack_3a0 = auVar34._8_4_;
  iStack_39c = auVar34._12_4_;
  local_398 = local_398 + local_3a8;
  iStack_390 = iStack_390 + iStack_3a0;
  uStack_984 = (undefined2)(iStack_394 + iStack_3a4);
  uStack_982 = (undefined2)((uint)(iStack_394 + iStack_3a4) >> 0x10);
  uStack_97c = (undefined2)(iStack_38c + iStack_39c);
  uStack_97a = (undefined2)((uint)(iStack_38c + iStack_39c) >> 0x10);
  local_3b8 = auVar33._0_4_;
  iStack_3b4 = auVar33._4_4_;
  iStack_3b0 = auVar33._8_4_;
  iStack_3ac = auVar33._12_4_;
  local_3c8 = auVar35._0_4_;
  iStack_3c4 = auVar35._4_4_;
  iStack_3c0 = auVar35._8_4_;
  iStack_3bc = auVar35._12_4_;
  local_3b8 = local_3b8 + local_3c8;
  iStack_3b0 = iStack_3b0 + iStack_3c0;
  uStack_a04 = (undefined2)(iStack_3b4 + iStack_3c4);
  uStack_a02 = (undefined2)((uint)(iStack_3b4 + iStack_3c4) >> 0x10);
  uStack_9fc = (undefined2)(iStack_3ac + iStack_3bc);
  uStack_9fa = (undefined2)((uint)(iStack_3ac + iStack_3bc) >> 0x10);
  local_78 = auVar36._0_4_;
  iStack_74 = auVar36._4_4_;
  iStack_70 = auVar36._8_4_;
  iStack_6c = auVar36._12_4_;
  local_88 = auVar44._0_4_;
  iStack_84 = auVar44._4_4_;
  iStack_80 = auVar44._8_4_;
  iStack_7c = auVar44._12_4_;
  uStack_974 = (undefined2)(iStack_74 - iStack_84);
  uStack_972 = (undefined2)((uint)(iStack_74 - iStack_84) >> 0x10);
  uStack_96c = (undefined2)(iStack_6c - iStack_7c);
  uStack_96a = (undefined2)((uint)(iStack_6c - iStack_7c) >> 0x10);
  local_98 = auVar37._0_4_;
  iStack_94 = auVar37._4_4_;
  iStack_90 = auVar37._8_4_;
  iStack_8c = auVar37._12_4_;
  local_a8 = auVar45._0_4_;
  iStack_a4 = auVar45._4_4_;
  iStack_a0 = auVar45._8_4_;
  iStack_9c = auVar45._12_4_;
  uStack_9f4 = (undefined2)(iStack_94 - iStack_a4);
  uStack_9f2 = (undefined2)((uint)(iStack_94 - iStack_a4) >> 0x10);
  uStack_9ec = (undefined2)(iStack_8c - iStack_9c);
  uStack_9ea = (undefined2)((uint)(iStack_8c - iStack_9c) >> 0x10);
  local_3d8 = auVar38._0_4_;
  iStack_3d4 = auVar38._4_4_;
  iStack_3d0 = auVar38._8_4_;
  iStack_3cc = auVar38._12_4_;
  local_3e8 = auVar40._0_4_;
  iStack_3e4 = auVar40._4_4_;
  iStack_3e0 = auVar40._8_4_;
  iStack_3dc = auVar40._12_4_;
  local_3d8 = local_3d8 + local_3e8;
  iStack_3d0 = iStack_3d0 + iStack_3e0;
  uStack_964 = (undefined2)(iStack_3d4 + iStack_3e4);
  uStack_962 = (undefined2)((uint)(iStack_3d4 + iStack_3e4) >> 0x10);
  uStack_95c = (undefined2)(iStack_3cc + iStack_3dc);
  uStack_95a = (undefined2)((uint)(iStack_3cc + iStack_3dc) >> 0x10);
  local_3f8 = auVar39._0_4_;
  iStack_3f4 = auVar39._4_4_;
  iStack_3f0 = auVar39._8_4_;
  iStack_3ec = auVar39._12_4_;
  local_408 = auVar41._0_4_;
  iStack_404 = auVar41._4_4_;
  iStack_400 = auVar41._8_4_;
  iStack_3fc = auVar41._12_4_;
  local_3f8 = local_3f8 + local_408;
  iStack_3f0 = iStack_3f0 + iStack_400;
  uStack_9e4 = (undefined2)(iStack_3f4 + iStack_404);
  uStack_9e2 = (undefined2)((uint)(iStack_3f4 + iStack_404) >> 0x10);
  uStack_9dc = (undefined2)(iStack_3ec + iStack_3fc);
  uStack_9da = (undefined2)((uint)(iStack_3ec + iStack_3fc) >> 0x10);
  iStack_b4 = (int)(CONCAT26(uStack_962,CONCAT24(uStack_964,local_3d8)) >> 0x20);
  iStack_ac = (int)(CONCAT26(uStack_95a,CONCAT24(uStack_95c,iStack_3d0)) >> 0x20);
  iStack_c4 = (int)(CONCAT26(uStack_982,CONCAT24(uStack_984,local_398)) >> 0x20);
  iStack_bc = (int)(CONCAT26(uStack_97a,CONCAT24(uStack_97c,iStack_390)) >> 0x20);
  uStack_954 = (undefined2)(iStack_b4 - iStack_c4);
  uStack_952 = (undefined2)((uint)(iStack_b4 - iStack_c4) >> 0x10);
  uStack_94c = (undefined2)(iStack_ac - iStack_bc);
  uStack_94a = (undefined2)((uint)(iStack_ac - iStack_bc) >> 0x10);
  iStack_d4 = (int)(CONCAT26(uStack_9e2,CONCAT24(uStack_9e4,local_3f8)) >> 0x20);
  iStack_cc = (int)(CONCAT26(uStack_9da,CONCAT24(uStack_9dc,iStack_3f0)) >> 0x20);
  iStack_e4 = (int)(CONCAT26(uStack_a02,CONCAT24(uStack_a04,local_3b8)) >> 0x20);
  iStack_dc = (int)(CONCAT26(uStack_9fa,CONCAT24(uStack_9fc,iStack_3b0)) >> 0x20);
  uStack_9d4 = (undefined2)(iStack_d4 - iStack_e4);
  uStack_9d2 = (undefined2)((uint)(iStack_d4 - iStack_e4) >> 0x10);
  uStack_9cc = (undefined2)(iStack_cc - iStack_dc);
  uStack_9ca = (undefined2)((uint)(iStack_cc - iStack_dc) >> 0x10);
  local_38 = auVar42._0_4_;
  local_58 = auVar43._0_4_;
  iStack_414 = (int)(CONCAT26(uStack_952,CONCAT24(uStack_954,local_3d8 - local_398)) >> 0x20);
  iStack_40c = (int)(CONCAT26(uStack_94a,CONCAT24(uStack_94c,iStack_3d0 - iStack_390)) >> 0x20);
  iStack_434 = (int)(CONCAT26(uStack_9d2,CONCAT24(uStack_9d4,local_3f8 - local_3b8)) >> 0x20);
  iStack_42c = (int)(CONCAT26(uStack_9ca,CONCAT24(uStack_9cc,iStack_3f0 - iStack_3b0)) >> 0x20);
  iStack_454 = (int)(CONCAT26(uStack_982,CONCAT24(uStack_984,local_398)) >> 0x20);
  iStack_44c = (int)(CONCAT26(uStack_97a,CONCAT24(uStack_97c,iStack_390)) >> 0x20);
  iStack_474 = (int)(CONCAT26(uStack_a02,CONCAT24(uStack_a04,local_3b8)) >> 0x20);
  iStack_46c = (int)(CONCAT26(uStack_9fa,CONCAT24(uStack_9fc,iStack_3b0)) >> 0x20);
  iStack_494 = (int)(CONCAT26(uStack_972,CONCAT24(uStack_974,local_78 - local_88)) >> 0x20);
  iStack_48c = (int)(CONCAT26(uStack_96a,CONCAT24(uStack_96c,iStack_70 - iStack_80)) >> 0x20);
  iStack_4b4 = (int)(CONCAT26(uStack_9f2,CONCAT24(uStack_9f4,local_98 - local_a8)) >> 0x20);
  iStack_4ac = (int)(CONCAT26(uStack_9ea,CONCAT24(uStack_9ec,iStack_90 - iStack_a0)) >> 0x20);
  iStack_4d4 = (int)(CONCAT26(uStack_962,CONCAT24(uStack_964,local_3d8)) >> 0x20);
  iStack_4cc = (int)(CONCAT26(uStack_95a,CONCAT24(uStack_95c,iStack_3d0)) >> 0x20);
  iStack_4f4 = (int)(CONCAT26(uStack_9e2,CONCAT24(uStack_9e4,local_3f8)) >> 0x20);
  iStack_4ec = (int)(CONCAT26(uStack_9da,CONCAT24(uStack_9dc,iStack_3f0)) >> 0x20);
  auVar45 = ZEXT416((uint)(int)in_DL);
  iVar27 = iStack_454 + iVar30 >> auVar45;
  iVar46 = iStack_44c + iVar30 >> auVar45;
  uStack_984 = (undefined2)iVar27;
  uStack_982 = (undefined2)((uint)iVar27 >> 0x10);
  uStack_97c = (undefined2)iVar46;
  uStack_97a = (undefined2)((uint)iVar46 >> 0x10);
  auVar47 = ZEXT416((uint)(int)in_DL);
  iVar27 = iStack_474 + iVar30 >> auVar47;
  iVar46 = iStack_46c + iVar30 >> auVar47;
  uStack_a04 = (undefined2)iVar27;
  uStack_a02 = (undefined2)((uint)iVar27 >> 0x10);
  uStack_9fc = (undefined2)iVar46;
  uStack_9fa = (undefined2)((uint)iVar46 >> 0x10);
  auVar44 = ZEXT416((uint)(int)in_DL);
  iVar27 = iStack_494 + iVar30 >> auVar44;
  iVar46 = iStack_48c + iVar30 >> auVar44;
  uStack_974 = (undefined2)iVar27;
  uStack_972 = (undefined2)((uint)iVar27 >> 0x10);
  uStack_96c = (undefined2)iVar46;
  uStack_96a = (undefined2)((uint)iVar46 >> 0x10);
  auVar48 = ZEXT416((uint)(int)in_DL);
  iVar27 = iStack_4b4 + iVar30 >> auVar48;
  iVar46 = iStack_4ac + iVar30 >> auVar48;
  uStack_9f4 = (undefined2)iVar27;
  uStack_9f2 = (undefined2)((uint)iVar27 >> 0x10);
  uStack_9ec = (undefined2)iVar46;
  uStack_9ea = (undefined2)((uint)iVar46 >> 0x10);
  auVar43 = ZEXT416((uint)(int)in_DL);
  iVar27 = iStack_4d4 + iVar30 >> auVar43;
  iVar46 = iStack_4cc + iVar30 >> auVar43;
  uStack_964 = (undefined2)iVar27;
  uStack_962 = (undefined2)((uint)iVar27 >> 0x10);
  uStack_95c = (undefined2)iVar46;
  uStack_95a = (undefined2)((uint)iVar46 >> 0x10);
  auVar49 = ZEXT416((uint)(int)in_DL);
  iVar27 = iStack_4f4 + iVar30 >> auVar49;
  iVar46 = iStack_4ec + iVar30 >> auVar49;
  uStack_9e4 = (undefined2)iVar27;
  uStack_9e2 = (undefined2)((uint)iVar27 >> 0x10);
  uStack_9dc = (undefined2)iVar46;
  uStack_9da = (undefined2)((uint)iVar46 >> 0x10);
  auVar42 = ZEXT416((uint)(int)in_DL);
  iVar27 = iStack_414 + iVar30 >> auVar42;
  iVar46 = iStack_40c + iVar30 >> auVar42;
  uStack_954 = (undefined2)iVar27;
  uStack_952 = (undefined2)((uint)iVar27 >> 0x10);
  uStack_94c = (undefined2)iVar46;
  uStack_94a = (undefined2)((uint)iVar46 >> 0x10);
  auVar50 = ZEXT416((uint)(int)in_DL);
  iVar27 = iStack_434 + iVar30 >> auVar50;
  iVar46 = iStack_42c + iVar30 >> auVar50;
  uStack_9d4 = (undefined2)iVar27;
  uStack_9d2 = (undefined2)((uint)iVar27 >> 0x10);
  uStack_9cc = (undefined2)iVar46;
  uStack_9ca = (undefined2)((uint)iVar46 >> 0x10);
  auVar23._4_2_ = uStack_984;
  auVar23._0_4_ = local_398 + iVar30 >> auVar45;
  auVar23._6_2_ = uStack_982;
  auVar23._12_2_ = uStack_97c;
  auVar23._8_4_ = iStack_390 + iVar30 >> auVar45;
  auVar23._14_2_ = uStack_97a;
  auVar22._4_2_ = uStack_a04;
  auVar22._0_4_ = local_3b8 + iVar30 >> auVar47;
  auVar22._6_2_ = uStack_a02;
  auVar22._12_2_ = uStack_9fc;
  auVar22._8_4_ = iStack_3b0 + iVar30 >> auVar47;
  auVar22._14_2_ = uStack_9fa;
  auVar45 = packssdw(auVar23,auVar22);
  *in_RSI = auVar45;
  auVar21._4_2_ = uStack_974;
  auVar21._0_4_ = (local_78 - local_88) + iVar30 >> auVar44;
  auVar21._6_2_ = uStack_972;
  auVar21._12_2_ = uStack_96c;
  auVar21._8_4_ = (iStack_70 - iStack_80) + iVar30 >> auVar44;
  auVar21._14_2_ = uStack_96a;
  auVar20._4_2_ = uStack_9f4;
  auVar20._0_4_ = (local_98 - local_a8) + iVar30 >> auVar48;
  auVar20._6_2_ = uStack_9f2;
  auVar20._12_2_ = uStack_9ec;
  auVar20._8_4_ = (iStack_90 - iStack_a0) + iVar30 >> auVar48;
  auVar20._14_2_ = uStack_9ea;
  auVar45 = packssdw(auVar21,auVar20);
  in_RSI[1] = auVar45;
  auVar19._4_2_ = uStack_964;
  auVar19._0_4_ = local_3d8 + iVar30 >> auVar43;
  auVar19._6_2_ = uStack_962;
  auVar19._12_2_ = uStack_95c;
  auVar19._8_4_ = iStack_3d0 + iVar30 >> auVar43;
  auVar19._14_2_ = uStack_95a;
  auVar18._4_2_ = uStack_9e4;
  auVar18._0_4_ = local_3f8 + iVar30 >> auVar49;
  auVar18._6_2_ = uStack_9e2;
  auVar18._12_2_ = uStack_9dc;
  auVar18._8_4_ = iStack_3f0 + iVar30 >> auVar49;
  auVar18._14_2_ = uStack_9da;
  auVar45 = packssdw(auVar19,auVar18);
  in_RSI[2] = auVar45;
  auVar17._4_2_ = uStack_954;
  auVar17._0_4_ = (local_3d8 - local_398) + local_38 * 3 + iVar30 >> auVar42;
  auVar17._6_2_ = uStack_952;
  auVar17._12_2_ = uStack_94c;
  auVar17._8_4_ = (iStack_3d0 - iStack_390) + iVar30 >> auVar42;
  auVar17._14_2_ = uStack_94a;
  auVar16._4_2_ = uStack_9d4;
  auVar16._0_4_ = (local_3f8 - local_3b8) + local_58 * 3 + iVar30 >> auVar50;
  auVar16._6_2_ = uStack_9d2;
  auVar16._12_2_ = uStack_9cc;
  auVar16._8_4_ = (iStack_3f0 - iStack_3b0) + iVar30 >> auVar50;
  auVar16._14_2_ = uStack_9ca;
  auVar45 = packssdw(auVar17,auVar16);
  in_RSI[3] = auVar45;
  return;
}

Assistant:

static void fadst8x4_new_sse2(const __m128i *input, __m128i *output,
                              int8_t cos_bit) {
  const int32_t *sinpi = sinpi_arr(cos_bit);
  const __m128i sinpi_p01_p02 = pair_set_epi16(sinpi[1], sinpi[2]);
  const __m128i sinpi_p04_m01 = pair_set_epi16(sinpi[4], -sinpi[1]);
  const __m128i sinpi_p03_p04 = pair_set_epi16(sinpi[3], sinpi[4]);
  const __m128i sinpi_m03_p02 = pair_set_epi16(-sinpi[3], sinpi[2]);
  const __m128i sinpi_p03_p03 = _mm_set1_epi16((int16_t)sinpi[3]);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));
  const __m128i in7 = _mm_add_epi16(input[0], input[1]);
  __m128i u_lo[8], u_hi[8], v_lo[8], v_hi[8];

  u_lo[0] = _mm_unpacklo_epi16(input[0], input[1]);
  u_hi[0] = _mm_unpackhi_epi16(input[0], input[1]);
  u_lo[1] = _mm_unpacklo_epi16(input[2], input[3]);
  u_hi[1] = _mm_unpackhi_epi16(input[2], input[3]);
  u_lo[2] = _mm_unpacklo_epi16(in7, __zero);
  u_hi[2] = _mm_unpackhi_epi16(in7, __zero);
  u_lo[3] = _mm_unpacklo_epi16(input[2], __zero);
  u_hi[3] = _mm_unpackhi_epi16(input[2], __zero);
  u_lo[4] = _mm_unpacklo_epi16(input[3], __zero);
  u_hi[4] = _mm_unpackhi_epi16(input[3], __zero);

  v_lo[0] = _mm_madd_epi16(u_lo[0], sinpi_p01_p02);  // s0 + s2
  v_hi[0] = _mm_madd_epi16(u_hi[0], sinpi_p01_p02);  // s0 + s2
  v_lo[1] = _mm_madd_epi16(u_lo[1], sinpi_p03_p04);  // s4 + s5
  v_hi[1] = _mm_madd_epi16(u_hi[1], sinpi_p03_p04);  // s4 + s5
  v_lo[2] = _mm_madd_epi16(u_lo[2], sinpi_p03_p03);  // x1
  v_hi[2] = _mm_madd_epi16(u_hi[2], sinpi_p03_p03);  // x1
  v_lo[3] = _mm_madd_epi16(u_lo[0], sinpi_p04_m01);  // s1 - s3
  v_hi[3] = _mm_madd_epi16(u_hi[0], sinpi_p04_m01);  // s1 - s3
  v_lo[4] = _mm_madd_epi16(u_lo[1], sinpi_m03_p02);  // -s4 + s6
  v_hi[4] = _mm_madd_epi16(u_hi[1], sinpi_m03_p02);  // -s4 + s6
  v_lo[5] = _mm_madd_epi16(u_lo[3], sinpi_p03_p03);  // s4
  v_hi[5] = _mm_madd_epi16(u_hi[3], sinpi_p03_p03);  // s4
  v_lo[6] = _mm_madd_epi16(u_lo[4], sinpi_p03_p03);
  v_hi[6] = _mm_madd_epi16(u_hi[4], sinpi_p03_p03);

  u_lo[0] = _mm_add_epi32(v_lo[0], v_lo[1]);
  u_hi[0] = _mm_add_epi32(v_hi[0], v_hi[1]);
  u_lo[1] = _mm_sub_epi32(v_lo[2], v_lo[6]);
  u_hi[1] = _mm_sub_epi32(v_hi[2], v_hi[6]);
  u_lo[2] = _mm_add_epi32(v_lo[3], v_lo[4]);
  u_hi[2] = _mm_add_epi32(v_hi[3], v_hi[4]);
  u_lo[3] = _mm_sub_epi32(u_lo[2], u_lo[0]);
  u_hi[3] = _mm_sub_epi32(u_hi[2], u_hi[0]);
  u_lo[4] = _mm_slli_epi32(v_lo[5], 2);
  u_hi[4] = _mm_slli_epi32(v_hi[5], 2);
  u_lo[5] = _mm_sub_epi32(u_lo[4], v_lo[5]);
  u_hi[5] = _mm_sub_epi32(u_hi[4], v_hi[5]);
  u_lo[6] = _mm_add_epi32(u_lo[3], u_lo[5]);
  u_hi[6] = _mm_add_epi32(u_hi[3], u_hi[5]);

  v_lo[0] = _mm_add_epi32(u_lo[0], __rounding);
  v_hi[0] = _mm_add_epi32(u_hi[0], __rounding);
  v_lo[1] = _mm_add_epi32(u_lo[1], __rounding);
  v_hi[1] = _mm_add_epi32(u_hi[1], __rounding);
  v_lo[2] = _mm_add_epi32(u_lo[2], __rounding);
  v_hi[2] = _mm_add_epi32(u_hi[2], __rounding);
  v_lo[3] = _mm_add_epi32(u_lo[6], __rounding);
  v_hi[3] = _mm_add_epi32(u_hi[6], __rounding);

  u_lo[0] = _mm_srai_epi32(v_lo[0], cos_bit);
  u_hi[0] = _mm_srai_epi32(v_hi[0], cos_bit);
  u_lo[1] = _mm_srai_epi32(v_lo[1], cos_bit);
  u_hi[1] = _mm_srai_epi32(v_hi[1], cos_bit);
  u_lo[2] = _mm_srai_epi32(v_lo[2], cos_bit);
  u_hi[2] = _mm_srai_epi32(v_hi[2], cos_bit);
  u_lo[3] = _mm_srai_epi32(v_lo[3], cos_bit);
  u_hi[3] = _mm_srai_epi32(v_hi[3], cos_bit);

  output[0] = _mm_packs_epi32(u_lo[0], u_hi[0]);
  output[1] = _mm_packs_epi32(u_lo[1], u_hi[1]);
  output[2] = _mm_packs_epi32(u_lo[2], u_hi[2]);
  output[3] = _mm_packs_epi32(u_lo[3], u_hi[3]);
}